

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_55dd6::GetSourcedv
          (anon_unknown_dwarf_55dd6 *this,ALsource *Source,ALCcontext *Context,SourceProp prop,
          span<double,_18446744073709551615UL> values)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  undefined4 in_register_0000000c;
  undefined1 (*pauVar14) [16];
  undefined8 *puVar15;
  ALCcontext *Context_00;
  undefined8 *puVar16;
  uint uVar17;
  long lVar18;
  pointer pdVar19;
  undefined8 uVar20;
  long lVar21;
  nanoseconds nVar22;
  span<int,_18446744073709551615UL> values_00;
  undefined1 auVar23 [16];
  nanoseconds srcclock;
  int ivals [6];
  nanoseconds local_50;
  int local_48;
  int local_44 [5];
  
  pauVar14 = (undefined1 (*) [16])CONCAT44(in_register_0000000c,prop);
  pdVar19 = values.mData;
  iVar11 = (int)Context;
  Context_00 = (ALCcontext *)((ulong)Context & 0xffffffff);
  lVar21 = *(long *)&Source[1].mDistanceModel;
  if (0x1200 < iVar11) {
    if (iVar11 < 0xc000) {
      if (iVar11 < 0x1212) {
        if (iVar11 == 0x1201) {
          values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
          if (((ulong)values_00.mDataEnd | 4) == 6) {
            dVar8 = GetSourceSecOffset((ALsource *)this,(ALCcontext *)Source,&local_50);
            *(double *)*pauVar14 = dVar8;
            iVar11 = pthread_mutex_lock((pthread_mutex_t *)(lVar21 + 0x6fc8));
            if (iVar11 != 0) {
              std::__throw_system_error(iVar11);
            }
            auVar23 = (**(code **)(**(long **)(lVar21 + 0x6ff0) + 0x30))();
            nVar22.__r = auVar23._8_8_ + *(long *)(lVar21 + 0x180);
            pthread_mutex_unlock((pthread_mutex_t *)(lVar21 + 0x6fc8));
            if (auVar23._0_8_ != local_50.__r) {
              lVar21 = auVar23._0_8_ - local_50.__r;
              if (nVar22.__r <= lVar21) {
                lVar21 = nVar22.__r;
              }
              nVar22.__r = nVar22.__r - lVar21;
            }
LAB_00126017:
            *(double *)(*pauVar14 + 8) = (double)nVar22.__r / 1000000000.0;
            return true;
          }
          Context_00 = (ALCcontext *)0x1201;
        }
        else {
          if (iVar11 != 0x1203) goto switchD_00125d1f_caseD_1008;
          values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
          if (((ulong)values_00.mDataEnd | 4) == 6) {
            dVar8 = GetSourceSecOffset((ALsource *)this,(ALCcontext *)Source,&local_50);
            *(double *)*pauVar14 = dVar8;
            nVar22.__r = local_50.__r;
            goto LAB_00126017;
          }
          Context_00 = (ALCcontext *)0x1203;
        }
        goto LAB_001265f4;
      }
      if ((iVar11 != 0x1212) && (iVar11 != 0x1214)) goto switchD_00125d1f_caseD_1008;
      goto switchD_00125d1f_caseD_1007;
    }
    switch(iVar11) {
    case 0x20007:
      values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
      if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
        dVar8 = (double)*(float *)(this + 0x7c);
        goto LAB_001263ef;
      }
      Context_00 = (ALCcontext *)0x20007;
      break;
    case 0x20008:
      values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
      if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
        dVar8 = (double)*(float *)(this + 0x80);
        goto LAB_001263ef;
      }
      Context_00 = (ALCcontext *)0x20008;
      break;
    case 0x20009:
      values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
      if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
        dVar8 = (double)*(float *)(this + 0x78);
        goto LAB_001263ef;
      }
      Context_00 = (ALCcontext *)0x20009;
      break;
    case 0x2000a:
    case 0x2000b:
    case 0x2000c:
      goto switchD_00125d1f_caseD_1007;
    default:
      if (iVar11 != 0xc000) {
        if (iVar11 != 0xd000) goto switchD_00125d1f_caseD_1008;
        goto switchD_00125d1f_caseD_1007;
      }
      values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
      if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
        dVar8 = (double)*(float *)(this + 0x84);
        goto LAB_001263ef;
      }
      Context_00 = (ALCcontext *)0xc000;
    }
    goto LAB_0012641b;
  }
  switch(iVar11) {
  case 0x1001:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar8 = (double)*(float *)(this + 0x14);
      goto LAB_001263ef;
    }
    Context_00 = (ALCcontext *)0x1001;
    break;
  case 0x1002:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar8 = (double)*(float *)(this + 0x18);
      goto LAB_001263ef;
    }
    Context_00 = (ALCcontext *)0x1002;
    break;
  case 0x1003:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar8 = (double)*(float *)this;
      goto LAB_001263ef;
    }
    Context_00 = (ALCcontext *)0x1003;
    break;
  case 0x1004:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
    if ((values_00.mDataEnd == (pointer)0x3) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar8 = (double)(float)((ulong)*(undefined8 *)(this + 0x28) >> 0x20);
      auVar7._8_4_ = SUB84(dVar8,0);
      auVar7._0_8_ = (double)(float)*(undefined8 *)(this + 0x28);
      auVar7._12_4_ = (int)((ulong)dVar8 >> 0x20);
      *pauVar14 = auVar7;
      dVar8 = (double)*(float *)(this + 0x30);
LAB_00126233:
      *(double *)pauVar14[1] = dVar8;
      return true;
    }
    Context_00 = (ALCcontext *)0x1004;
    goto LAB_001265b8;
  case 0x1005:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
    if ((values_00.mDataEnd == (pointer)0x3) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar8 = (double)(float)((ulong)*(undefined8 *)(this + 0x40) >> 0x20);
      auVar6._8_4_ = SUB84(dVar8,0);
      auVar6._0_8_ = (double)(float)*(undefined8 *)(this + 0x40);
      auVar6._12_4_ = (int)((ulong)dVar8 >> 0x20);
      *pauVar14 = auVar6;
      dVar8 = (double)*(float *)(this + 0x48);
      goto LAB_00126233;
    }
    Context_00 = (ALCcontext *)0x1005;
    goto LAB_001265b8;
  case 0x1006:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
    if ((values_00.mDataEnd == (pointer)0x3) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar8 = (double)(float)((ulong)*(undefined8 *)(this + 0x34) >> 0x20);
      auVar5._8_4_ = SUB84(dVar8,0);
      auVar5._0_8_ = (double)(float)*(undefined8 *)(this + 0x34);
      auVar5._12_4_ = (int)((ulong)dVar8 >> 0x20);
      *pauVar14 = auVar5;
      dVar8 = (double)*(float *)(this + 0x3c);
      goto LAB_00126233;
    }
    Context_00 = (ALCcontext *)0x1006;
LAB_001265b8:
    uVar20 = 3;
    goto LAB_0012632f;
  case 0x1007:
  case 0x1010:
  case 0x1015:
  case 0x1016:
  case 0x1027:
  case 0x1033:
    goto switchD_00125d1f_caseD_1007;
  case 0x1008:
  case 0x1009:
  case 0x100b:
  case 0x100c:
  case 0x1011:
  case 0x1012:
  case 0x1013:
  case 0x1014:
  case 0x1017:
  case 0x1018:
  case 0x1019:
  case 0x101a:
  case 0x101b:
  case 0x101c:
  case 0x101d:
  case 0x101e:
  case 0x101f:
  case 0x1028:
  case 0x1029:
  case 0x102a:
  case 0x102b:
  case 0x102c:
  case 0x102d:
  case 0x102e:
  case 0x102f:
  case 0x1032:
switchD_00125d1f_caseD_1008:
    if (0 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected property: 0x%04x\n",Context_00);
    }
    ALCcontext::setError
              ((ALCcontext *)Source,0xa002,"Invalid source double property 0x%04x",Context_00);
    return false;
  case 0x100a:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar8 = (double)*(float *)(this + 4);
      goto LAB_001263ef;
    }
    Context_00 = (ALCcontext *)0x100a;
    break;
  case 0x100d:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar8 = (double)*(float *)(this + 0xc);
      goto LAB_001263ef;
    }
    Context_00 = (ALCcontext *)0x100d;
    break;
  case 0x100e:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar8 = (double)*(float *)(this + 0x10);
      goto LAB_001263ef;
    }
    Context_00 = (ALCcontext *)0x100e;
    break;
  case 0x100f:
    if ((long)pdVar19 - (long)pauVar14 == 0x30) {
      dVar8 = (double)(float)((ulong)*(undefined8 *)(this + 0x4c) >> 0x20);
      auVar2._8_4_ = SUB84(dVar8,0);
      auVar2._0_8_ = (double)(float)*(undefined8 *)(this + 0x4c);
      auVar2._12_4_ = (int)((ulong)dVar8 >> 0x20);
      *pauVar14 = auVar2;
      dVar8 = (double)(float)((ulong)*(undefined8 *)(this + 0x54) >> 0x20);
      auVar3._8_4_ = SUB84(dVar8,0);
      auVar3._0_8_ = (double)(float)*(undefined8 *)(this + 0x54);
      auVar3._12_4_ = (int)((ulong)dVar8 >> 0x20);
      pauVar14[1] = auVar3;
      dVar8 = (double)(float)((ulong)*(undefined8 *)(this + 0x5c) >> 0x20);
      auVar4._8_4_ = SUB84(dVar8,0);
      auVar4._0_8_ = (double)(float)*(undefined8 *)(this + 0x5c);
      auVar4._12_4_ = (int)((ulong)dVar8 >> 0x20);
      pauVar14[2] = auVar4;
      return true;
    }
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
    Context_00 = (ALCcontext *)0x100f;
    uVar20 = 6;
    goto LAB_0012632f;
  case 0x1020:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar8 = (double)*(float *)(this + 0x1c);
      goto LAB_001263ef;
    }
    Context_00 = (ALCcontext *)0x1020;
    break;
  case 0x1021:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar8 = (double)*(float *)(this + 0x24);
      goto LAB_001263ef;
    }
    Context_00 = (ALCcontext *)0x1021;
    break;
  case 0x1022:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar8 = (double)*(float *)(this + 8);
      goto LAB_001263ef;
    }
    Context_00 = (ALCcontext *)0x1022;
    break;
  case 0x1023:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar8 = (double)*(float *)(this + 0x20);
      goto LAB_001263ef;
    }
    Context_00 = (ALCcontext *)0x1023;
    break;
  case 0x1024:
  case 0x1025:
  case 0x1026:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      uVar10 = 0;
      uVar17 = 0;
      puVar15 = (undefined8 *)0x0;
      do {
        do {
          uVar1 = *(uint *)(lVar21 + 0x6fb8);
        } while ((uVar1 & 1) != 0);
        if ((*(ulong *)&(Source->Send)._M_elems[5].LFReference <= (ulong)*(uint *)(this + 0x18c)) ||
           (lVar18 = *(long *)(*(long *)&(Source->Send)._M_elems[5].HFReference + 8 +
                              (ulong)*(uint *)(this + 0x18c) * 8),
           *(int *)(lVar18 + 0x170) != *(int *)(this + 400))) {
          *(undefined4 *)(this + 0x18c) = 0xffffffff;
          lVar18 = 0;
        }
        if (lVar18 != 0) {
          puVar15 = *(undefined8 **)(lVar18 + 0x188);
          uVar17 = *(uint *)(lVar18 + 0x17c);
          uVar10 = *(uint *)(lVar18 + 0x180);
        }
      } while (uVar1 != *(uint *)(lVar21 + 0x6fb8));
      dVar8 = 0.0;
      if (lVar18 == 0) goto LAB_001263ef;
      lVar21 = 0;
      for (puVar16 = *(undefined8 **)(this + 0x180); puVar16 != (undefined8 *)0x0;
          puVar16 = (undefined8 *)*puVar16) {
        if (lVar21 == 0) {
          lVar21 = puVar16[2];
        }
        if (puVar16 == puVar15) break;
        uVar17 = uVar17 + *(int *)(puVar16 + 1);
      }
      bVar9 = lVar21 == 0;
      if (puVar16 != (undefined8 *)0x0 && bVar9) {
        do {
          lVar21 = puVar16[2];
          puVar16 = (undefined8 *)*puVar16;
          bVar9 = lVar21 == 0;
          if (puVar16 == (undefined8 *)0x0) break;
        } while (lVar21 == 0);
      }
      if (bVar9) {
        __assert_fail("BufferFmt != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rbetik12[P]FallingSand/lib/vx-sound/lib/openal/al/source.cpp"
                      ,0x143,
                      "double (anonymous namespace)::GetSourceOffset(ALsource *, ALenum, ALCcontext *)"
                     );
      }
      if (iVar11 != 0x1026) {
        if (iVar11 == 0x1025) {
          dVar8 = (double)uVar10 * 0.000244140625 + (double)uVar17;
        }
        else {
          dVar8 = 0.0;
          if (iVar11 == 0x1024) {
            dVar8 = ((double)uVar10 * 0.000244140625 + (double)uVar17) /
                    (double)*(uint *)(lVar21 + 0x28);
          }
        }
        goto LAB_001263ef;
      }
      if (*(char *)(lVar21 + 0x4c) == -0x7f) {
        uVar12 = *(uint *)(lVar21 + 0x38);
        uVar10 = *(uint *)(lVar21 + 0x54);
        iVar11 = (uVar10 - 2 >> 1) + 7;
LAB_0012639d:
        uVar12 = ChannelsFromFmt(*(FmtChannels *)(lVar21 + 0x2c),uVar12);
        uVar17 = (uVar17 / uVar10) * uVar12 * iVar11;
      }
      else {
        if (*(char *)(lVar21 + 0x4c) == -0x80) {
          uVar12 = *(uint *)(lVar21 + 0x38);
          uVar10 = *(uint *)(lVar21 + 0x54);
          iVar11 = (uVar10 - 1 >> 1) + 4;
          goto LAB_0012639d;
        }
        uVar12 = ChannelsFromFmt(*(FmtChannels *)(lVar21 + 0x2c),*(uint *)(lVar21 + 0x38));
        uVar13 = BytesFromFmt(*(FmtType *)(lVar21 + 0x2d));
        uVar17 = uVar12 * uVar17 * uVar13;
      }
      dVar8 = (double)uVar17;
LAB_001263ef:
      *(double *)*pauVar14 = dVar8;
      return true;
    }
    break;
  case 0x1030:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
    if (((ulong)values_00.mDataEnd | 4) == 6) {
      dVar8 = (double)(float)((ulong)*(undefined8 *)(this + 0x88) >> 0x20);
      auVar23._8_4_ = SUB84(dVar8,0);
      auVar23._0_8_ = (double)(float)*(undefined8 *)(this + 0x88);
      auVar23._12_4_ = (int)((ulong)dVar8 >> 0x20);
      *pauVar14 = auVar23;
      return true;
    }
    Context_00 = (ALCcontext *)0x1030;
LAB_001265f4:
    uVar20 = 2;
    goto LAB_0012632f;
  case 0x1031:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar8 = (double)*(float *)(this + 0x90);
      goto LAB_001263ef;
    }
    Context_00 = (ALCcontext *)0x1031;
    break;
  default:
    if (iVar11 != 0x202) goto switchD_00125d1f_caseD_1008;
    goto switchD_00125d1f_caseD_1007;
  }
LAB_0012641b:
  uVar20 = 1;
LAB_0012632f:
  ALCcontext::setError
            ((ALCcontext *)Source,0xa002,"Property 0x%04x expects %d value(s), got %zu",Context_00,
             uVar20,values_00.mDataEnd);
  return false;
switchD_00125d1f_caseD_1007:
  values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar14 >> 3);
  if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
    values_00.mData = local_44;
    bVar9 = GetSourceiv(this,Source,Context_00,(SourceProp)&local_48,values_00);
    if (bVar9) {
      *(double *)*pauVar14 = (double)local_48;
      return bVar9;
    }
    return bVar9;
  }
  goto LAB_0012641b;
}

Assistant:

bool GetSourcedv(ALsource *Source, ALCcontext *Context, SourceProp prop, const al::span<double> values)
{
    ALCdevice *device{Context->mDevice.get()};
    ClockLatency clocktime;
    nanoseconds srcclock;
    int ivals[MaxValues];
    bool err;

    switch(prop)
    {
    case AL_GAIN:
        CHECKSIZE(values, 1);
        values[0] = Source->Gain;
        return true;

    case AL_PITCH:
        CHECKSIZE(values, 1);
        values[0] = Source->Pitch;
        return true;

    case AL_MAX_DISTANCE:
        CHECKSIZE(values, 1);
        values[0] = Source->MaxDistance;
        return true;

    case AL_ROLLOFF_FACTOR:
        CHECKSIZE(values, 1);
        values[0] = Source->RolloffFactor;
        return true;

    case AL_REFERENCE_DISTANCE:
        CHECKSIZE(values, 1);
        values[0] = Source->RefDistance;
        return true;

    case AL_CONE_INNER_ANGLE:
        CHECKSIZE(values, 1);
        values[0] = Source->InnerAngle;
        return true;

    case AL_CONE_OUTER_ANGLE:
        CHECKSIZE(values, 1);
        values[0] = Source->OuterAngle;
        return true;

    case AL_MIN_GAIN:
        CHECKSIZE(values, 1);
        values[0] = Source->MinGain;
        return true;

    case AL_MAX_GAIN:
        CHECKSIZE(values, 1);
        values[0] = Source->MaxGain;
        return true;

    case AL_CONE_OUTER_GAIN:
        CHECKSIZE(values, 1);
        values[0] = Source->OuterGain;
        return true;

    case AL_SEC_OFFSET:
    case AL_SAMPLE_OFFSET:
    case AL_BYTE_OFFSET:
        CHECKSIZE(values, 1);
        values[0] = GetSourceOffset(Source, prop, Context);
        return true;

    case AL_CONE_OUTER_GAINHF:
        CHECKSIZE(values, 1);
        values[0] = Source->OuterGainHF;
        return true;

    case AL_AIR_ABSORPTION_FACTOR:
        CHECKSIZE(values, 1);
        values[0] = Source->AirAbsorptionFactor;
        return true;

    case AL_ROOM_ROLLOFF_FACTOR:
        CHECKSIZE(values, 1);
        values[0] = Source->RoomRolloffFactor;
        return true;

    case AL_DOPPLER_FACTOR:
        CHECKSIZE(values, 1);
        values[0] = Source->DopplerFactor;
        return true;

    case AL_SOURCE_RADIUS:
        CHECKSIZE(values, 1);
        values[0] = Source->Radius;
        return true;

    case AL_STEREO_ANGLES:
        CHECKSIZE(values, 2);
        values[0] = Source->StereoPan[0];
        values[1] = Source->StereoPan[1];
        return true;

    case AL_SEC_OFFSET_LATENCY_SOFT:
        CHECKSIZE(values, 2);
        /* Get the source offset with the clock time first. Then get the clock
         * time with the device latency. Order is important.
         */
        values[0] = GetSourceSecOffset(Source, Context, &srcclock);
        {
            std::lock_guard<std::mutex> _{device->StateLock};
            clocktime = GetClockLatency(device);
        }
        if(srcclock == clocktime.ClockTime)
            values[1] = static_cast<double>(clocktime.Latency.count()) / 1000000000.0;
        else
        {
            /* If the clock time incremented, reduce the latency by that much
             * since it's that much closer to the source offset it got earlier.
             */
            const nanoseconds diff{clocktime.ClockTime - srcclock};
            const nanoseconds latency{clocktime.Latency - std::min(clocktime.Latency, diff)};
            values[1] = static_cast<double>(latency.count()) / 1000000000.0;
        }
        return true;

    case AL_SEC_OFFSET_CLOCK_SOFT:
        CHECKSIZE(values, 2);
        values[0] = GetSourceSecOffset(Source, Context, &srcclock);
        values[1] = static_cast<double>(srcclock.count()) / 1000000000.0;
        return true;

    case AL_POSITION:
        CHECKSIZE(values, 3);
        values[0] = Source->Position[0];
        values[1] = Source->Position[1];
        values[2] = Source->Position[2];
        return true;

    case AL_VELOCITY:
        CHECKSIZE(values, 3);
        values[0] = Source->Velocity[0];
        values[1] = Source->Velocity[1];
        values[2] = Source->Velocity[2];
        return true;

    case AL_DIRECTION:
        CHECKSIZE(values, 3);
        values[0] = Source->Direction[0];
        values[1] = Source->Direction[1];
        values[2] = Source->Direction[2];
        return true;

    case AL_ORIENTATION:
        CHECKSIZE(values, 6);
        values[0] = Source->OrientAt[0];
        values[1] = Source->OrientAt[1];
        values[2] = Source->OrientAt[2];
        values[3] = Source->OrientUp[0];
        values[4] = Source->OrientUp[1];
        values[5] = Source->OrientUp[2];
        return true;

    /* 1x int */
    case AL_SOURCE_RELATIVE:
    case AL_LOOPING:
    case AL_SOURCE_STATE:
    case AL_BUFFERS_QUEUED:
    case AL_BUFFERS_PROCESSED:
    case AL_SOURCE_TYPE:
    case AL_DIRECT_FILTER_GAINHF_AUTO:
    case AL_AUXILIARY_SEND_FILTER_GAIN_AUTO:
    case AL_AUXILIARY_SEND_FILTER_GAINHF_AUTO:
    case AL_DIRECT_CHANNELS_SOFT:
    case AL_DISTANCE_MODEL:
    case AL_SOURCE_RESAMPLER_SOFT:
    case AL_SOURCE_SPATIALIZE_SOFT:
        CHECKSIZE(values, 1);
        if((err=GetSourceiv(Source, Context, prop, {ivals, 1u})) != false)
            values[0] = static_cast<double>(ivals[0]);
        return err;

    case AL_BUFFER:
    case AL_DIRECT_FILTER:
    case AL_AUXILIARY_SEND_FILTER:
    case AL_SAMPLE_OFFSET_LATENCY_SOFT:
    case AL_SAMPLE_OFFSET_CLOCK_SOFT:
        break;
    }

    ERR("Unexpected property: 0x%04x\n", prop);
    Context->setError(AL_INVALID_ENUM, "Invalid source double property 0x%04x", prop);
    return false;
}